

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O0

void __thiscall llvm::DWARFGdbIndex::dumpCUList(DWARFGdbIndex *this,raw_ostream *OS)

{
  raw_ostream *prVar1;
  unsigned_long *in_R8;
  unsigned_long *in_R9;
  int local_94;
  format_object<unsigned_int,_unsigned_long,_unsigned_long> local_90;
  const_iterator local_68;
  CompUnitEntry *CU;
  const_iterator __end1;
  const_iterator __begin1;
  SmallVector<llvm::DWARFGdbIndex::CompUnitEntry,_0U> *__range1;
  size_t sStack_40;
  uint32_t I;
  format_object<unsigned_int,_unsigned_long> local_38;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  DWARFGdbIndex *this_local;
  
  local_18 = OS;
  OS_local = (raw_ostream *)this;
  sStack_40 = SmallVectorBase::size((SmallVectorBase *)&this->CuList);
  format<unsigned_int,unsigned_long>
            (&local_38,(llvm *)"\n  CU list offset = 0x%x, has %ld entries:",
             (char *)&this->CuListOffset,(uint *)&stack0xffffffffffffffc0,in_R8);
  prVar1 = raw_ostream::operator<<(OS,&local_38.super_format_object_base);
  raw_ostream::operator<<(prVar1,'\n');
  __range1._4_4_ = 0;
  __begin1 = (const_iterator)&this->CuList;
  __end1 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>::begin
                     ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void> *)
                      __begin1);
  CU = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>::end
                 ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void> *)__begin1);
  for (; prVar1 = local_18, __end1 != CU; __end1 = __end1 + 1) {
    local_68 = __end1;
    local_94 = __range1._4_4_;
    __range1._4_4_ = __range1._4_4_ + 1;
    format<unsigned_int,unsigned_long,unsigned_long>
              (&local_90,(llvm *)"    %d: Offset = 0x%llx, Length = 0x%llx\n",(char *)&local_94,
               (uint *)__end1,&__end1->Length,in_R9);
    raw_ostream::operator<<(prVar1,&local_90.super_format_object_base);
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpCUList(raw_ostream &OS) const {
  OS << format("\n  CU list offset = 0x%x, has %" PRId64 " entries:",
               CuListOffset, (uint64_t)CuList.size())
     << '\n';
  uint32_t I = 0;
  for (const CompUnitEntry &CU : CuList)
    OS << format("    %d: Offset = 0x%llx, Length = 0x%llx\n", I++, CU.Offset,
                 CU.Length);
}